

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitBlockExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,BlockExpr *expr)

{
  string *psVar1;
  pointer puVar2;
  Stmt *pSVar3;
  Expr *pEVar4;
  ostream *poVar5;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *statement;
  pointer puVar6;
  string local_1d8 [32];
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  psVar1 = &this->m_ident;
  poVar5 = std::operator<<(local_1a8,(string *)psVar1);
  std::operator<<(poVar5,"(Expr::Block (\n");
  std::__cxx11::string::append((char *)psVar1);
  puVar2 = (expr->stmts).
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (expr->stmts).
                super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    poVar5 = std::operator<<(local_1a8,(string *)psVar1);
    pSVar3 = (puVar6->_M_t).super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>.
             _M_t.super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
             super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl;
    (*pSVar3->_vptr_Stmt[2])(local_1d8,pSVar3,this);
    poVar5 = std::operator<<(poVar5,local_1d8);
    std::operator<<(poVar5,'\n');
    std::__cxx11::string::~string(local_1d8);
  }
  poVar5 = std::operator<<(local_1a8,(string *)psVar1);
  pEVar4 = (expr->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar4->_vptr_Expr[2])(local_1d8,pEVar4,&this->field_0x8);
  poVar5 = std::operator<<(poVar5,local_1d8);
  std::operator<<(poVar5,')');
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::erase((ulong)psVar1,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitBlockExpr(BlockExpr &expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Block (\n";
        m_ident += "    ";

        for (auto &statement : expr.stmts) {
            s << m_ident << visitStmt(*statement) << '\n';
        }
        s << m_ident << visitExpr(*expr.expr) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }